

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O2

STRING_HANDLE URL_Decode(STRING_HANDLE input)

{
  char cVar1;
  size_t i;
  char *pcVar2;
  size_t sVar3;
  LOGGER_LOG p_Var4;
  byte *memory;
  STRING_HANDLE pSVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  size_t sVar18;
  char cVar9;
  
  if (input == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar2 = "URL_Decode:: NULL input";
    iVar6 = 0x142;
    goto LAB_0012f83b;
  }
  pcVar2 = STRING_c_str(input);
  sVar3 = strlen(pcVar2);
  if (pcVar2 != (char *)0x0) {
    if (sVar3 != 0) {
      uVar17 = 0;
      lVar12 = 1;
      sVar18 = 0;
      sVar10 = sVar3;
LAB_0012f60d:
      if (sVar3 <= uVar17) goto LAB_0012f7fa;
      bVar13 = pcVar2[uVar17];
      uVar11 = (ulong)bVar13;
      lVar15 = lVar12;
      if (uVar11 < 0x2f) {
        if ((0x670200000001U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 != 0x25) goto LAB_0012f6b9;
          if (((2 < sVar10) &&
              ((bVar13 = pcVar2[uVar17 + 1], (byte)(bVar13 - 0x30) < 10 ||
               ((bVar13 - 0x41 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)(bVar13 - 0x41) & 0x3f) & 1) != 0)))))) &&
             (((byte)(pcVar2[uVar17 + 2] - 0x30U) < 10 ||
              ((uVar14 = (byte)pcVar2[uVar17 + 2] - 0x41, uVar14 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) != 0)))))) {
            lVar15 = 3;
            if ((bVar13 & 0xf8) == 0x30) goto LAB_0012f62e;
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar16 = "Out of range of characters accepted by this decoder";
              iVar6 = 0x87;
              goto LAB_0012f7f5;
            }
            goto LAB_0012f7fa;
          }
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0012f7fa;
          pcVar16 = "Incomplete or invalid percent encoding";
          iVar6 = 0x82;
          goto LAB_0012f7f5;
        }
      }
      else {
LAB_0012f6b9:
        if (((9 < (byte)(bVar13 - 0x30)) && (bVar13 != 0x5f)) &&
           (0x19 < (byte)((bVar13 & 0xdf) + 0xbf))) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0012f7fa;
          pcVar16 = "Unprintable value in encoded string";
          iVar6 = 0x92;
LAB_0012f7f5:
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                    ,"calculateDecodedStringSize",iVar6,1,pcVar16);
          goto LAB_0012f7fa;
        }
      }
LAB_0012f62e:
      sVar18 = sVar18 + 1;
      if (sVar18 == 0) {
        sVar18 = 0xffffffffffffffff;
      }
      uVar17 = uVar17 + lVar15;
      sVar10 = sVar10 - lVar15;
      goto LAB_0012f60d;
    }
    sVar10 = 1;
    goto LAB_0012f845;
  }
  p_Var4 = xlogging_get_log_function();
  if (p_Var4 != (LOGGER_LOG)0x0) {
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
              ,"calculateDecodedStringSize",0x70,1,"Null encoded string");
  }
  goto LAB_0012f808;
LAB_0012f7fa:
  sVar10 = sVar18 + 1;
  if (sVar18 + 1 == 0) {
    sVar10 = 0xffffffffffffffff;
  }
  if (pcVar2[uVar17] == '\0') {
LAB_0012f845:
    memory = (byte *)malloc(sVar10);
    if (memory != (byte *)0x0) {
      pbVar7 = memory;
      for (uVar17 = 0; uVar17 <= sVar3; uVar17 = uVar17 + lVar12) {
        bVar13 = pcVar2[uVar17];
        lVar12 = 1;
        if (bVar13 == 0x25) {
          cVar1 = pcVar2[uVar17 + 1];
          bVar8 = cVar1 - 0x30;
          if (9 < bVar8) {
            cVar9 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar9 = cVar1;
            }
            bVar8 = cVar9 - 0x37;
          }
          cVar1 = pcVar2[uVar17 + 2];
          bVar13 = cVar1 - 0x30;
          if (9 < bVar13) {
            cVar9 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar9 = cVar1;
            }
            bVar13 = cVar9 - 0x37;
          }
          bVar13 = bVar8 << 4 | bVar13;
          lVar12 = 3;
        }
        *pbVar7 = bVar13;
        pbVar7 = pbVar7 + 1;
      }
      pSVar5 = STRING_new_with_memory((char *)memory);
      if (pSVar5 == (STRING_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                    ,"URL_Decode",0x15b,1,"URL_Decode:: MALLOC failure on decode");
        }
        free(memory);
        return (STRING_HANDLE)0x0;
      }
      return pSVar5;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar2 = "URL_Decode:: MALLOC failure on decode.";
    iVar6 = 0x152;
    goto LAB_0012f83b;
  }
LAB_0012f808:
  p_Var4 = xlogging_get_log_function();
  if (p_Var4 == (LOGGER_LOG)0x0) {
    return (STRING_HANDLE)0x0;
  }
  pcVar2 = "URL_Decode:: Invalid input string";
  iVar6 = 0x14d;
LAB_0012f83b:
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
            ,"URL_Decode",iVar6,1,pcVar2);
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE URL_Decode(STRING_HANDLE input)
{
    STRING_HANDLE result;
    if (input == NULL)
    {
        LogError("URL_Decode:: NULL input");
        result = NULL;
    }
    else
    {
        size_t decodedStringSize;
        char* decodedString;
        const char* inputString = STRING_c_str(input);
        size_t inputLen = strlen(inputString);
        if ((decodedStringSize = calculateDecodedStringSize(inputString, inputLen)) == 0)
        {
            LogError("URL_Decode:: Invalid input string");
            result = NULL;
        }
        else if ((decodedString = (char*)malloc(decodedStringSize)) == NULL)
        {
            LogError("URL_Decode:: MALLOC failure on decode.");
            result = NULL;
        }
        else
        {
            createDecodedString(inputString, inputLen, decodedString);
            result = STRING_new_with_memory(decodedString);
            if (result == NULL)
            {
                LogError("URL_Decode:: MALLOC failure on decode");
                free(decodedString);
            }
        }
    }
    return result;
}